

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# users.h
# Opt level: O2

void __thiscall wasm::DataFlow::Users::build(Users *this,Graph *graph)

{
  Node *pNVar1;
  pointer ppNVar2;
  _Insert<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  *this_00;
  unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> *node;
  pointer puVar3;
  pointer ppNVar4;
  Node *local_48;
  Node *value;
  pointer local_38;
  
  local_38 = (graph->nodes).
             super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (graph->nodes).
                super__Vector_base<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != local_38; puVar3 = puVar3 + 1)
  {
    pNVar1 = (puVar3->_M_t).
             super___uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
             .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl;
    ppNVar2 = *(pointer *)
               ((long)&(pNVar1->values).
                       super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
               + 8);
    for (ppNVar4 = *(pointer *)
                    &(pNVar1->values).
                     super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                     ._M_impl; ppNVar4 != ppNVar2; ppNVar4 = ppNVar4 + 1) {
      local_48 = *ppNVar4;
      this_00 = (_Insert<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                 *)std::__detail::
                   _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this,&local_48);
      value = (puVar3->_M_t).
              super___uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
              .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl;
      std::__detail::
      _Insert<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert(this_00,&value);
    }
  }
  return;
}

Assistant:

void build(Graph& graph) {
    for (auto& node : graph.nodes) {
      for (auto* value : node->values) {
        users[value].insert(node.get());
      }
    }
  }